

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O0

void obj_no_longer_held(obj *obj)

{
  int iVar1;
  obj *local_18;
  obj *contents;
  obj *obj_local;
  
  if (obj != (obj *)0x0) {
    if ((((0xd9 < obj->otyp) && (obj->otyp < 0xe2)) || (obj->otyp == 0x215)) &&
       (obj->cobj != (obj *)0x0)) {
      for (local_18 = obj->cobj; local_18 != (obj *)0x0; local_18 = local_18->nobj) {
        obj_no_longer_held(local_18);
      }
    }
    if ((obj->otyp == 0x1a) &&
       (((*(uint *)&obj->field_0x4a >> 0xc & 1) == 0 || (iVar1 = rn2(10), iVar1 == 0)))) {
      obj->otyp = 0x19;
      *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffffefff;
    }
  }
  return;
}

Assistant:

void obj_no_longer_held(struct obj *obj)
{
	if (!obj) {
	    return;
	} else if ((Is_container(obj) || obj->otyp == STATUE) && obj->cobj) {
	    struct obj *contents;
	    for (contents=obj->cobj; contents; contents=contents->nobj)
		obj_no_longer_held(contents);
	}
	switch(obj->otyp) {
	case CRYSKNIFE:
	    /* KMH -- Fixed crysknives have only 10% chance of reverting */
	    /* only changes when not held by player or monster */
	    if (!obj->oerodeproof || !rn2(10)) {
		obj->otyp = WORM_TOOTH;
		obj->oerodeproof = 0;
	    }
	    break;
	}
}